

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall
cmDepends::cmDepends(cmDepends *this,cmLocalUnixMakefileGenerator3 *lg,string *targetDir)

{
  string *targetDir_local;
  cmLocalUnixMakefileGenerator3 *lg_local;
  cmDepends *this_local;
  
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_00fb15a8;
  this->LocalGenerator = lg;
  this->Verbose = false;
  this->FileTimeCache = (cmFileTimeCache *)0x0;
  std::__cxx11::string::string((string *)&this->Language);
  std::__cxx11::string::string((string *)&this->TargetDirectory,(string *)targetDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePath);
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalUnixMakefileGenerator3* lg, std::string targetDir)
  : LocalGenerator(lg)
  , TargetDirectory(std::move(targetDir))
{
}